

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

FunctionCall * __thiscall
soul::PoolAllocator::
allocate<soul::AST::FunctionCall,soul::AST::Context&,soul::AST::Function&,soul::pool_ptr<soul::AST::CommaSeparatedList>&,bool>
          (PoolAllocator *this,Context *args,Function *args_1,
          pool_ptr<soul::AST::CommaSeparatedList> *args_2,bool *args_3)

{
  DestructorFn *pDVar1;
  Context *this_00;
  _lambda_void___1_ local_55 [13];
  pool_ptr<soul::AST::CommaSeparatedList> local_48;
  FunctionCall *local_40;
  FunctionCall *newObject;
  PoolItem *newItem;
  bool *args_local_3;
  pool_ptr<soul::AST::CommaSeparatedList> *args_local_2;
  Function *args_local_1;
  Context *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_3;
  args_local_3 = (bool *)args_2;
  args_local_2 = (pool_ptr<soul::AST::CommaSeparatedList> *)args_1;
  args_local_1 = (Function *)args;
  args_local = (Context *)this;
  newObject = (FunctionCall *)allocateSpaceForObject(this,0x48);
  this_00 = &(newObject->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
             context;
  local_48.object = *(CommaSeparatedList **)args_local_3;
  AST::FunctionCall::FunctionCall
            ((FunctionCall *)this_00,(Context *)args_local_1,(Function *)args_local_2,&local_48,
             (bool)((byte)newItem->size & 1));
  pool_ptr<soul::AST::CommaSeparatedList>::~pool_ptr(&local_48);
  local_40 = (FunctionCall *)this_00;
  pDVar1 = allocate(soul::AST::Context&,soul::AST::Function&,soul::pool_ptr&,bool&&)::
           {lambda(void*)#1}::operator_cast_to_function_pointer(local_55);
  *(DestructorFn **)
   &(newObject->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.objectType =
       pDVar1;
  return local_40;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }